

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O2

vector<Interval,_std::allocator<Interval>_> *
expandLatest(vector<Interval,_std::allocator<Interval>_> *__return_storage_ptr__,Interval *latest,
            Rules *rules)

{
  bool bVar1;
  int iVar2;
  pointer pIVar3;
  vector<Range,_std::allocator<Range>_> exclusions;
  vector<Interval,_std::allocator<Interval>_> flattened;
  Interval interval;
  
  (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Range::is_open(&latest->super_Range);
  if (bVar1) {
    Datetime::Datetime((Datetime *)&flattened);
    Range::Range(&interval.super_Range,&(latest->super_Range).start,(Datetime *)&flattened);
    getAllExclusions(&exclusions,rules,&interval.super_Range);
    if (exclusions.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        exclusions.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      flatten(&flattened,latest,&exclusions);
      if (1 < (ulong)(((long)flattened.super__Vector_base<Interval,_std::allocator<Interval>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)flattened.super__Vector_base<Interval,_std::allocator<Interval>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0xc0)) {
        std::
        __reverse<__gnu_cxx::__normal_iterator<Interval*,std::vector<Interval,std::allocator<Interval>>>>
                  (flattened.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   flattened.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   ((long)flattened.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)flattened.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                         super__Vector_impl_data._M_start) % 0xc0);
        iVar2 = 1;
        for (pIVar3 = flattened.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pIVar3 != flattened.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                      super__Vector_impl_data._M_finish; pIVar3 = pIVar3 + 1) {
          Interval::Interval(&interval,pIVar3);
          interval.synthetic = true;
          interval.id = iVar2;
          std::vector<Interval,_std::allocator<Interval>_>::emplace_back<Interval>
                    (__return_storage_ptr__,&interval);
          Interval::~Interval(&interval);
          iVar2 = iVar2 + 1;
        }
      }
      std::vector<Interval,_std::allocator<Interval>_>::~vector(&flattened);
    }
    std::vector<Range,_std::allocator<Range>_>::~vector(&exclusions);
  }
  if ((__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<Interval,_std::allocator<Interval>_>::push_back(__return_storage_ptr__,latest);
    (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
    super__Vector_impl_data._M_finish[-1].id = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector <Interval> expandLatest (const Interval& latest, const Rules& rules)
{
  int current_id = 0;
  std::vector <Interval> intervals;
  // If the latest interval is open, check for synthetic intervals
  if (latest.is_open ())
  {
    auto exclusions = getAllExclusions (rules, {latest.start, Datetime ()});
    if (! exclusions.empty ())
    {
      std::vector <Interval> flattened = flatten (latest, exclusions);

      // If flatten() converted the latest interval into a group of synthetic
      // intervals, the number of returned intervals will be greater than 1.
      // Otherwise, it just returned the non-synthetic, latest interval.
      if (flattened.size () > 1)
      {
        std::reverse (flattened.begin (), flattened.end ());
        for (auto interval : flattened)
        {
          interval.synthetic = true;
          interval.id = ++current_id;
          intervals.push_back (std::move (interval));
        }
      }
    }
  }

  if (intervals.empty ())
  {
    intervals.push_back (latest);
    intervals.back ().id = 1;
  }
  return intervals;
}